

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_finish_event.cpp
# Opt level: O2

TaskExecutionResult __thiscall
duckdb::PipelineFinishTask::ExecuteTask(PipelineFinishTask *this,TaskExecutionMode mode)

{
  shared_ptr<duckdb::Event,_true> *this_00;
  Pipeline *pPVar1;
  int iVar2;
  PhysicalOperator *pPVar3;
  type pEVar4;
  pointer pGVar5;
  Event *this_01;
  TaskExecutionResult TVar6;
  optional_ptr<duckdb::PhysicalOperator,_true> sink;
  OperatorSinkFinalizeInput finalize_input;
  InterruptState interrupt_state;
  optional_ptr<duckdb::PhysicalOperator,_true> local_78;
  __shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> local_70;
  __weak_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  InterruptState local_50;
  
  local_78.ptr = (this->pipeline->sink).ptr;
  enable_shared_from_this<duckdb::Task>::shared_from_this
            ((enable_shared_from_this<duckdb::Task> *)&local_70);
  ::std::__weak_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<duckdb::Task,void>
            (local_60,&local_70);
  InterruptState::InterruptState(&local_50,(weak_ptr<duckdb::Task,_true> *)local_60);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_58);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_refcount);
  pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&local_78);
  local_70._M_ptr =
       (element_type *)
       unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
       operator*(&pPVar3->sink_state);
  local_70._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_50;
  pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&local_78);
  pPVar1 = this->pipeline;
  this_00 = &(this->super_ExecutorTask).event;
  pEVar4 = shared_ptr<duckdb::Event,_true>::operator*(this_00);
  iVar2 = (*pPVar3->_vptr_PhysicalOperator[0x1d])
                    (pPVar3,pPVar1,pEVar4,((this->super_ExecutorTask).executor)->context,&local_70);
  TVar6 = TASK_BLOCKED;
  if ((SinkFinalizeType)iVar2 != BLOCKED) {
    pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&local_78);
    pGVar5 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&pPVar3->sink_state);
    pGVar5->state = (SinkFinalizeType)iVar2;
    this_01 = shared_ptr<duckdb::Event,_true>::operator->(this_00);
    Event::FinishTask(this_01);
    TVar6 = TASK_FINISHED;
  }
  InterruptState::~InterruptState(&local_50);
  return TVar6;
}

Assistant:

TaskExecutionResult ExecuteTask(TaskExecutionMode mode) override {
		auto sink = pipeline.GetSink();
		InterruptState interrupt_state(shared_from_this());
		OperatorSinkFinalizeInput finalize_input {*sink->sink_state, interrupt_state};

#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
		if (debug_blocked_count < debug_blocked_target_count) {
			debug_blocked_count++;

			auto &callback_state = interrupt_state;
			std::thread rewake_thread([callback_state] {
				std::this_thread::sleep_for(std::chrono::milliseconds(1));
				callback_state.Callback();
			});
			rewake_thread.detach();

			return TaskExecutionResult::TASK_BLOCKED;
		}
#endif
		auto sink_state = sink->Finalize(pipeline, *event, executor.context, finalize_input);

		if (sink_state == SinkFinalizeType::BLOCKED) {
			return TaskExecutionResult::TASK_BLOCKED;
		}

		sink->sink_state->state = sink_state;
		event->FinishTask();
		return TaskExecutionResult::TASK_FINISHED;
	}